

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnicodeSet::indexOf(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  int iVar2;
  UChar32 limit;
  UChar32 start;
  int32_t n;
  int32_t i;
  UChar32 c_local;
  UnicodeSet *this_local;
  
  if ((-1 < c) && (c < 0x110000)) {
    start = 0;
    limit = 0;
    while( true ) {
      iVar2 = start + 1;
      iVar1 = this->list[start];
      if (c < iVar1) break;
      start = start + 2;
      if (c < this->list[iVar2]) {
        return (limit + c) - iVar1;
      }
      limit = (this->list[iVar2] - iVar1) + limit;
    }
  }
  return -1;
}

Assistant:

int32_t UnicodeSet::indexOf(UChar32 c) const {
    if (c < MIN_VALUE || c > MAX_VALUE) {
        return -1;
    }
    int32_t i = 0;
    int32_t n = 0;
    for (;;) {
        UChar32 start = list[i++];
        if (c < start) {
            return -1;
        }
        UChar32 limit = list[i++];
        if (c < limit) {
            return n + c - start;
        }
        n += limit - start;
    }
}